

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_socket.c
# Opt level: O0

cio_error cio_server_socket_set_tcp_fast_open(cio_server_socket *server_socket,_Bool on)

{
  int iVar1;
  int *piVar2;
  undefined4 local_20;
  int ret;
  int qlen;
  _Bool on_local;
  cio_server_socket *server_socket_local;
  
  local_20 = 0;
  if (on) {
    local_20 = 5;
  }
  ret._3_1_ = on;
  _qlen = server_socket;
  iVar1 = setsockopt((server_socket->impl).ev.fd,6,0x17,&local_20,4);
  if (iVar1 == 0) {
    server_socket_local._4_4_ = CIO_SUCCESS;
  }
  else {
    piVar2 = __errno_location();
    server_socket_local._4_4_ = -*piVar2;
  }
  return server_socket_local._4_4_;
}

Assistant:

enum cio_error cio_server_socket_set_tcp_fast_open(const struct cio_server_socket *server_socket, bool on)
{
	int qlen = 0;
	if (on) {
		qlen = CONFIG_TCP_FASTOPEN_QUEUE_SIZE;
	}

	int ret = setsockopt(server_socket->impl.ev.fd, SOL_TCP, TCP_FASTOPEN, &qlen, sizeof(qlen));
	if (cio_unlikely(ret != 0)) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}